

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

Scene * book_cover(void)

{
  Point3 look_from;
  Point3 look_at;
  int iVar1;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  Scene *in_RDI;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  double dVar4;
  shared_ptr<Metal> material3;
  shared_ptr<Lambertian> material2;
  shared_ptr<Dielectric> material1;
  ObjectList objects;
  shared_ptr<Lambertian> ground_mat;
  Camera camera;
  shared_ptr<Metal> local_2a8;
  shared_ptr<Lambertian> local_298;
  undefined1 local_279;
  shared_ptr<Dielectric> local_278;
  undefined8 local_268;
  Sphere *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_250;
  _func_int **local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  int local_21c;
  _func_int **local_218;
  vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_> local_210;
  value_type local_1f8;
  value_type local_1e8;
  value_type local_1d8;
  Scene *local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  value_type local_198;
  value_type local_188;
  value_type local_178;
  value_type local_168;
  shared_ptr<Lambertian> local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  Camera local_e8;
  
  local_248 = (_func_int **)&PTR_hit_0010fb28;
  local_218 = (_func_int **)&PTR_hit_0010fb28;
  local_210.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_210.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_210.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010fb98;
  local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_0010fc10;
  local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 0;
  local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0x3fe00000;
  local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x3fe0000000000000;
  local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_use_count = 0;
  local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_weak_count = 0x3fe00000;
  local_e8.origin_.e[0] = 0.0;
  local_e8.origin_.e[1] = -1000.0;
  local_e8.origin_.e[2] = 0.0;
  local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                1000);
  local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Sphere,std::allocator<Sphere>,Vec3,int,std::shared_ptr<Lambertian>&>
            (&local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Sphere **)&local_278,(allocator<Sphere> *)&local_2a8,&local_e8.origin_,
             (int *)&local_298,&local_158);
  local_168.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_168.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
            (&local_210,&local_168);
  if (local_168.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_1c0 = in_RDI;
  if (local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  iVar1 = -0xb;
  do {
    local_1b8 = (double)iVar1;
    iVar3 = -0xb;
    local_21c = iVar1;
    do {
      if (nrand()::distribution == '\0') {
        book_cover();
      }
      if (nrand()::generator == '\0') {
        book_cover();
      }
      local_1a0 = std::
                  generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                              *)nrand()::generator);
      local_1b0 = DAT_00110258;
      local_1a8 = nrand()::distribution;
      if (nrand()::distribution == '\0') {
        book_cover();
      }
      if (nrand()::generator == '\0') {
        book_cover();
      }
      local_230 = std::
                  generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                              *)nrand()::generator);
      local_240 = DAT_00110258;
      local_238 = nrand()::distribution;
      if (nrand()::distribution == '\0') {
        book_cover();
      }
      if (nrand()::generator == '\0') {
        book_cover();
      }
      dVar4 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)nrand()::generator);
      local_e8.origin_.e[0] = (local_230 * (local_240 - local_238) + local_238) * 0.9 + local_1b8;
      local_e8.origin_.e[2] =
           (dVar4 * (DAT_00110258 - nrand()::distribution) + nrand()::distribution) * 0.9 +
           (double)iVar3;
      local_e8.origin_.e[1] = 0.2;
      if (2.0 < SQRT(local_e8.origin_.e[2] * local_e8.origin_.e[2] +
                     (local_e8.origin_.e[0] + -4.0) * (local_e8.origin_.e[0] + -4.0) + 0.0)) {
        dVar4 = local_1a0 * (local_1b0 - local_1a8) + local_1a8;
        if (0.8 <= dVar4) {
          if (dVar4 < 0.95) {
            Vec3::random();
            if (nrand()::distribution == '\0') {
              book_cover();
            }
            if (nrand()::generator == '\0') {
              book_cover();
            }
            local_230 = std::
                        generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                  ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                    *)nrand()::generator);
            local_240 = DAT_00110258;
            local_238 = nrand()::distribution;
            local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
            (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_use_count = 1;
            (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_weak_count = 1;
            (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010fc50;
            local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi + 1);
            local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            [1]._vptr__Sp_counted_base = (_func_int **)&PTR_scatter_0010fca0;
            *(element_type **)
             &local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              [1]._M_use_count =
                 local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            [2]._vptr__Sp_counted_base =
                 (_func_int **)
                 local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
            local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            [2]._M_use_count = (undefined4)local_268;
            local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            [2]._M_weak_count = local_268._4_4_;
            local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            [3]._vptr__Sp_counted_base =
                 (_func_int **)((local_230 * (local_240 - local_238) + local_238) * 0.5 + 0.0);
            local_258 = (Sphere *)0x3fc999999999999a;
            local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<Sphere,std::allocator<Sphere>,Vec3&,double,std::shared_ptr<Metal>&>
                      (&local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (Sphere **)&local_2a8,(allocator<Sphere> *)&local_228,&local_e8.origin_,
                       (double *)&local_258,(shared_ptr<Metal> *)&local_298);
            local_1e8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_1e8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::
            push_back(&local_210,&local_1e8);
            _Var2._M_pi = local_1e8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            goto LAB_00108866;
          }
          local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
          (local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = 1;
          (local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_weak_count = 1;
          (local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010fcd0;
          local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi + 1);
          local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_0010fd20;
          local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_use_count = 0;
          local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_weak_count = 0x3ff80000;
          local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x3fc999999999999a;
          local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<Sphere,std::allocator<Sphere>,Vec3&,double,std::shared_ptr<Dielectric>&>
                    (&local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Sphere **)&local_298,(allocator<Sphere> *)&local_258,
                     &local_e8.origin_,(double *)&local_2a8,&local_278);
          local_1f8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1f8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                    (&local_210,&local_1f8);
          if (local_1f8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1f8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
          }
          _Var2._M_pi = local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          if (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var2._M_pi = local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
          }
        }
        else {
          Vec3::random();
          local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
          (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = 1;
          (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_weak_count = 1;
          (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010fb98;
          local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi + 1);
          local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_0010fc10;
          *(element_type **)
           &local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            [1]._M_use_count =
               local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
          _vptr__Sp_counted_base =
               (_func_int **)
               local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
          _M_use_count = (undefined4)local_268;
          local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
          _M_weak_count = local_268._4_4_;
          local_258 = (Sphere *)0x3fc999999999999a;
          local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<Sphere,std::allocator<Sphere>,Vec3&,double,std::shared_ptr<Lambertian>&>
                    (&local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (Sphere **)&local_2a8,(allocator<Sphere> *)&local_228,&local_e8.origin_,
                     (double *)&local_258,&local_298);
          local_1d8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_1d8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                    (&local_210,&local_1d8);
          _Var2._M_pi = local_1d8.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                        ._M_pi;
LAB_00108866:
          if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
          }
          _Var2._M_pi = local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          if (local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
            _Var2._M_pi = local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
          }
        }
        if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
        }
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0xb);
    iVar1 = local_21c + 1;
    if (iVar1 == 0xb) {
      local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      (local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010fcd0;
      local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
           1);
      local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_0010fd20;
      local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_use_count = 0;
      local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_weak_count = 0x3ff80000;
      local_e8.origin_.e[0] = 0.0;
      local_e8.origin_.e[1] = 1.0;
      local_e8.origin_.e[2] = 0.0;
      local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x3ff0000000000000;
      local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Sphere,std::allocator<Sphere>,Vec3,double,std::shared_ptr<Dielectric>&>
                (&local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Sphere **)&local_298,(allocator<Sphere> *)&local_258,&local_e8.origin_,
                 (double *)&local_2a8,&local_278);
      local_178.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_178.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                (&local_210,&local_178);
      if (local_178.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
      (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010fb98;
      local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
           1);
      local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_0010fc10;
      local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_use_count = -0x66666666;
      local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_weak_count = 0x3fd99999;
      local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _vptr__Sp_counted_base = (_func_int **)0x3fc999999999999a;
      local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _M_use_count = -0x66666666;
      local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _M_weak_count = 0x3fb99999;
      local_e8.origin_.e[0] = -4.0;
      local_e8.origin_.e[1] = 1.0;
      local_e8.origin_.e[2] = 0.0;
      local_258 = (Sphere *)0x3ff0000000000000;
      local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Sphere,std::allocator<Sphere>,Vec3,double,std::shared_ptr<Lambertian>&>
                (&local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Sphere **)&local_2a8,(allocator<Sphere> *)&local_228,&local_e8.origin_,
                 (double *)&local_258,&local_298);
      local_188.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_188.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                (&local_210,&local_188);
      if (local_188.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_188.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
      (local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010fc50;
      local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
      local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _vptr__Sp_counted_base = (_func_int **)&PTR_scatter_0010fca0;
      local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_use_count = 0x66666666;
      local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _M_weak_count = 0x3fe66666;
      local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _vptr__Sp_counted_base = (_func_int **)0x3fe3333333333333;
      local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _M_use_count = 0;
      local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
      _M_weak_count = 0x3fe00000;
      local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
      _vptr__Sp_counted_base = (_func_int **)0x0;
      local_e8.origin_.e[0] = 4.0;
      local_e8.origin_.e[1] = 1.0;
      local_e8.origin_.e[2] = 0.0;
      local_228 = 1.0;
      local_258 = (Sphere *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Sphere,std::allocator<Sphere>,Vec3,double,std::shared_ptr<Metal>&>
                (&_Stack_250,&local_258,(allocator<Sphere> *)&local_279,&local_e8.origin_,&local_228
                 ,&local_2a8);
      local_198.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_258->super_Object;
      local_198.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_250._M_pi;
      local_258 = (Sphere *)0x0;
      _Stack_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
                (&local_210,&local_198);
      if (local_198.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_198.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (_Stack_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_250._M_pi);
      }
      local_108 = 0x4024000000000000;
      uStack_100 = 0x4000000000000000;
      local_f8 = 0xc014000000000000;
      local_128 = 0;
      uStack_120 = 0;
      local_118 = 0;
      local_148 = 0;
      uStack_144 = 0;
      uStack_140 = 0;
      uStack_13c = 0x3ff00000;
      local_138 = 0;
      look_from.e[1] = 2.0;
      look_from.e[0] = 10.0;
      look_from.e[2] = -5.0;
      look_at.e[2] = 0.0;
      look_at.e[0] = 0.0;
      look_at.e[1] = 0.0;
      Camera::Camera(&local_e8,look_from,look_at,(Vec3)(ZEXT824(0x3ff0000000000000) << 0x40),30.0,
                     1.7777777777777777,0.1,10.0);
      (local_1c0->objects_).super_Object._vptr_Object = local_248;
      std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::vector
                (&(local_1c0->objects_).objects_,&local_210);
      memcpy(&local_1c0->camera_,&local_e8,0xb0);
      if (local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2a8.super___shared_ptr<Metal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      if (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_298.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_278.super___shared_ptr<Dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.super___shared_ptr<Lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      local_218 = local_248;
      std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::~vector
                (&local_210);
      return local_1c0;
    }
  } while( true );
}

Assistant:

Scene book_cover() {

  ObjectList objects;

  auto ground_mat = std::make_shared<Lambertian>(Color(0.5, 0.5, 0.5));
  objects.add(std::make_shared<Sphere>(Point3(0, -1000, 0), 1000, ground_mat));

  for (int a = -11; a < 11; a++) {
    for (int b = -11; b < 11; b++) {
      auto choose_mat = nrand();
      Point3 center{a + 0.9*nrand(), 0.2, b + 0.9*nrand()};

      if ((center - Vec3(4, 0.2, 0)).length() > 2.0) {
        if (choose_mat < 0.8) {
          Color albedo = Color::random(0, 1);
          auto sphere_material = std::make_shared<Lambertian>(albedo);
          objects.add(std::make_shared<Sphere>(center, 0.2, sphere_material));
        } else if (choose_mat < 0.95) {
          auto albedo = Color::random(0.5, 1);
          auto fuzz = nrand(0, 0.5);
          auto sphere_material = std::make_shared<Metal>(albedo, fuzz);
          objects.add(std::make_shared<Sphere>(center, 0.2, sphere_material));
        } else {
          // glass
          auto sphere_material = std::make_shared<Dielectric>(1.5);
          objects.add(std::make_shared<Sphere>(center, 0.2, sphere_material));
        }
      }
    }
  }

  auto material1 = std::make_shared<Dielectric>(1.5);
  objects.add(std::make_shared<Sphere>(Point3(0, 1, 0), 1.0, material1));

  auto material2 = std::make_shared<Lambertian>(Color(0.4, 0.2, 0.1));
  objects.add(std::make_shared<Sphere>(Point3(-4, 1, 0), 1.0, material2));

  auto material3 = std::make_shared<Metal>(Color(0.7, 0.6, 0.5), 0.0);
  objects.add(std::make_shared<Sphere>(Point3(4, 1, 0), 1.0, material3));

  // Setup camera
  Point3 camera_position{10, 2, -5};
  Point3 camera_target{0, 0, 0};
  double field_of_view = 30;
  double aperture = 0.1;
  double focal_dist = 10.0;

  Camera camera(camera_position,
                camera_target,
                Point3(0, 1, 0),
                field_of_view,
                ASPECT_RATIO,
                aperture,
                10.0);
  return {objects, camera};
}